

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall
wallet::CWallet::DelAddressBookWithDB(CWallet *this,WalletBatch *batch,CTxDestination *address)

{
  bool bVar1;
  isminetype iVar2;
  char *fmt;
  long in_FS_OFFSET;
  allocator<char> local_69;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock52;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  EncodeDestination_abi_cxx11_(&local_48,address);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock52,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x9b2,false);
  iVar2 = IsMine(this,address);
  if (iVar2 == ISMINE_NO) {
    bVar1 = WalletBatch::EraseAddressData(batch,address);
    if (bVar1) {
      bVar1 = WalletBatch::ErasePurpose(batch,&local_48);
      if (bVar1) {
        bVar1 = WalletBatch::EraseName(batch,&local_48);
        if (bVar1) {
          bVar1 = true;
          std::
          _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
          ::erase(&(this->m_address_book)._M_t,address);
          goto LAB_0014fa1a;
        }
        fmt = "Error: cannot erase address book entry name\n";
      }
      else {
        fmt = "Error: cannot erase address book entry purpose\n";
      }
    }
    else {
      fmt = "Error: cannot erase address book entry data\n";
    }
    WalletLogPrintf<>(this,fmt);
  }
  else {
    WalletLogPrintf<char_const*,char_const*>
              (this,"%s called with IsMine address, NOT SUPPORTED. Please report this bug! %s\n",
               "DelAddressBookWithDB","https://github.com/bitcoin/bitcoin/issues");
  }
  bVar1 = false;
LAB_0014fa1a:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  if (bVar1 != false) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&criticalblock52,"",&local_69);
    boost::signals2::
    signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyAddressBookChanged,address,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &criticalblock52,false,SEND,CT_DELETED);
    std::__cxx11::string::~string((string *)&criticalblock52);
  }
  std::__cxx11::string::~string((string *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::DelAddressBookWithDB(WalletBatch& batch, const CTxDestination& address)
{
    const std::string& dest = EncodeDestination(address);
    {
        LOCK(cs_wallet);
        // If we want to delete receiving addresses, we should avoid calling EraseAddressData because it will delete the previously_spent value. Could instead just erase the label so it becomes a change address, and keep the data.
        // NOTE: This isn't a problem for sending addresses because they don't have any data that needs to be kept.
        // When adding new address data, it should be considered here whether to retain or delete it.
        if (IsMine(address)) {
            WalletLogPrintf("%s called with IsMine address, NOT SUPPORTED. Please report this bug! %s\n", __func__, PACKAGE_BUGREPORT);
            return false;
        }
        // Delete data rows associated with this address
        if (!batch.EraseAddressData(address)) {
            WalletLogPrintf("Error: cannot erase address book entry data\n");
            return false;
        }

        // Delete purpose entry
        if (!batch.ErasePurpose(dest)) {
            WalletLogPrintf("Error: cannot erase address book entry purpose\n");
            return false;
        }

        // Delete name entry
        if (!batch.EraseName(dest)) {
            WalletLogPrintf("Error: cannot erase address book entry name\n");
            return false;
        }

        // finally, remove it from the map
        m_address_book.erase(address);
    }

    // All good, signal changes
    NotifyAddressBookChanged(address, "", /*is_mine=*/false, AddressPurpose::SEND, CT_DELETED);
    return true;
}